

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerup::Serialize(APowerup *this,FSerializer *arc)

{
  BYTE *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  FSerializer *pFVar4;
  FName *pFVar5;
  FName *pFVar6;
  PClass *pPVar3;
  
  AInventory::Serialize(&this->super_AInventory,arc);
  pPVar3 = (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject)
                      (this);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class = pPVar3;
  }
  pBVar1 = pPVar3->Defaults;
  pFVar6 = (FName *)0x0;
  pFVar5 = (FName *)(pBVar1 + 0x4fc);
  if (save_full != false) {
    pFVar5 = pFVar6;
  }
  pFVar4 = ::Serialize(arc,"effecttics",(int32_t *)&(this->super_AInventory).field_0x4fc,
                       &pFVar5->Index);
  pFVar5 = (FName *)(pBVar1 + 0x500);
  if (save_full != false) {
    pFVar5 = pFVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"blendcolor",(uint32_t *)&this->BlendColor,(uint32_t *)pFVar5);
  pFVar5 = (FName *)(pBVar1 + 0x504);
  if (save_full != false) {
    pFVar5 = pFVar6;
  }
  pFVar4 = ::Serialize(pFVar4,"mode",&(this->Mode).super_FName,pFVar5);
  pFVar5 = (FName *)(pBVar1 + 0x508);
  if (save_full != false) {
    pFVar5 = pFVar6;
  }
  ::Serialize(pFVar4,"strength",&this->Strength,(double *)pFVar5);
  return;
}

Assistant:

void APowerup::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	auto def = (APowerup*)GetDefault();
	arc("effecttics", EffectTics, def->EffectTics)
		("blendcolor", BlendColor, def->BlendColor)
		("mode", Mode, def->Mode)
		("strength", Strength, def->Strength);
}